

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateAppleLibraryScript
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,Indent indent)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  Indent IVar4;
  Indent IVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string depNameVar;
  string depName;
  undefined1 local_c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  string local_a0;
  string local_80;
  undefined1 local_60 [32];
  undefined8 local_40;
  char *local_38;
  
  IVar5.Level = indent.Level;
  local_a8 = evaluatedRPaths;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar5.Level = IVar5.Level + -1;
    } while (IVar5.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(NOT ",7);
  pcVar1 = this->TmpVarPrefix;
  iVar2 = (int)os;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_dep MATCHES \"\\\\.framework/\")\n",0x1e);
  pcVar1 = this->TmpVarPrefix;
  local_60._0_8_ = strlen(pcVar1);
  local_60._16_8_ = 4;
  local_60._24_8_ = "_dep";
  views._M_len = 2;
  views._M_array = (iterator)local_60;
  local_60._8_8_ = pcVar1;
  cmCatViews_abi_cxx11_(&local_80,views);
  GetDestination((string *)local_60,this,config);
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  IVar5.Level = indent.Level + 2;
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,(string *)local_60,cmInstallType_SHARED_LIBRARY,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,false,(this->Permissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             " FOLLOW_SYMLINK_CHAIN",IVar5,local_80._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  IVar4.Level = IVar5.Level;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar4.Level = IVar4.Level + -1;
    } while (IVar4.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"get_filename_component(",0x17);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_dep_name \"${",0xd);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_dep}\" NAME)\n",0xd);
  pcVar1 = this->TmpVarPrefix;
  local_60._16_8_ = strlen(pcVar1);
  local_60._0_8_ = (pointer)0x2;
  local_60._8_8_ = "${";
  local_40 = 10;
  local_38 = "_dep_name}";
  views_00._M_len = 3;
  views_00._M_array = (iterator)local_60;
  local_60._24_8_ = pcVar1;
  cmCatViews_abi_cxx11_((string *)local_c8,views_00);
  pcVar1 = this->TmpVarPrefix;
  local_60._16_8_ = strlen(pcVar1);
  local_60._0_8_ = (pointer)0x2;
  local_60._8_8_ = "${";
  local_40 = 5;
  local_38 = "_dep}";
  views_01._M_len = 3;
  views_01._M_array = (iterator)local_60;
  local_60._24_8_ = pcVar1;
  cmCatViews_abi_cxx11_(&local_a0,views_01);
  GenerateInstallNameFixup(this,os,config,local_a8,&local_a0,(string *)local_c8,IVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      indent.Level = indent.Level + -1;
    } while (indent.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateAppleLibraryScript(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, Indent indent)
{
  os << indent << "if(NOT " << this->TmpVarPrefix
     << "_dep MATCHES \"\\\\.framework/\")\n";

  auto depName = cmStrCat(this->TmpVarPrefix, "_dep");
  this->AddInstallRule(
    os, this->GetDestination(config), cmInstallType_SHARED_LIBRARY, {}, false,
    this->Permissions.c_str(), nullptr, nullptr, " FOLLOW_SYMLINK_CHAIN",
    indent.Next(), depName.c_str());

  os << indent.Next() << "get_filename_component(" << this->TmpVarPrefix
     << "_dep_name \"${" << this->TmpVarPrefix << "_dep}\" NAME)\n";
  auto depNameVar = cmStrCat("${", this->TmpVarPrefix, "_dep_name}");
  this->GenerateInstallNameFixup(os, config, evaluatedRPaths,
                                 cmStrCat("${", this->TmpVarPrefix, "_dep}"),
                                 depNameVar, indent.Next());

  os << indent << "endif()\n";
}